

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

double Catch::Benchmark::Detail::mean(const_iterator first,const_iterator last)

{
  bool bVar1;
  difference_type dVar2;
  reference pdVar3;
  double local_28;
  double sum;
  difference_type count;
  const_iterator last_local;
  const_iterator first_local;
  
  count = (difference_type)last._M_current;
  last_local = first;
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)&count,&last_local);
  local_28 = 0.0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&last_local,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        *)&count);
    if (!bVar1) break;
    pdVar3 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&last_local);
    local_28 = *pdVar3 + local_28;
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&last_local);
  }
  return local_28 / (double)dVar2;
}

Assistant:

double mean( std::vector<double>::const_iterator first,
                         std::vector<double>::const_iterator last ) {
                auto count = last - first;
                double sum = 0.;
                while (first != last) {
                    sum += *first;
                    ++first;
                }
                return sum / static_cast<double>(count);
            }